

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O1

void launch_cold_9(void)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = _stderr;
  pcVar1 = strerror(1);
  fprintf(__stream,"Addind a marker to the mmiotrace returned error %i: %s\n",1,pcVar1);
  return;
}

Assistant:

static int
force_timing_changes(uint8_t wanted_perflvl, int mmiotrace)
{
	Display *dpy = NULL;
	int ret = 0, i = 0;

	/* wait for X to come up */
	do
	{
		usleep(10000); /* 10 ms */
		dpy = XOpenDisplay(NULL);
		i++;
	} while(!dpy && i < 200 ); /* wait 2 seconds */
	fprintf(stderr, "-- Display opened\n");

	if (!dpy) {
		fprintf(stderr, "ERROR - XOpenDisplay failed\n");
		return 1;
	}

	if (!upclock_card(dpy)) {
		if (mmiotrace) {
			ret = write_to_file("/sys/kernel/debug/tracing/trace_marker", "Start downclocking\n");
			if (ret)
				fprintf(stderr, "Addind a marker to the mmiotrace returned error %i: %s\n", ret, strerror(ret));
		}

		if (!wait_for_perflvl(dpy, wanted_perflvl)) {
			fprintf(stderr, "Downclock monitoring finished\n");
			ret = 0;
		}
	}

	/* wait for PDAEMON to actually change the memory clock */
	sleep(1);

	XCloseDisplay(dpy);
	fprintf(stderr, "-- Display closed (pid = %i)\n", getpid());

	return ret;
}